

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O3

void assume_value_suite::get_string(void)

{
  int iVar1;
  size_type __size;
  wchar_t *pwVar2;
  char *__function;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  string value;
  variable data;
  wchar_t *local_e8;
  ulong local_e0;
  long local_d8 [2];
  type local_c8;
  char local_a8;
  wchar_t *local_98;
  ulong local_90;
  wchar_t local_88;
  undefined4 uStack_84;
  undefined8 local_80;
  wchar_t *local_78;
  ulong local_70;
  undefined2 local_68;
  undefined6 uStack_66;
  undefined8 local_60;
  wchar_t *local_58;
  size_t local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined8 local_40;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_38;
  
  local_e8 = (wchar_t *)local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"alpha","");
  local_58 = (wchar_t *)&local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_e8,local_e0 + (long)local_e8);
  local_c8._8_8_ = local_50;
  local_c8._0_8_ = local_c8.__data + 0x10;
  if (local_58 == (wchar_t *)&local_48) {
    pwVar2 = (wchar_t *)(local_c8.__data + 0x18);
  }
  else {
    local_40 = CONCAT71(uStack_47,local_48);
    pwVar2 = (wchar_t *)local_c8._0_8_;
    local_c8._0_8_ = local_58;
    local_58 = (wchar_t *)&local_48;
  }
  local_48 = 0;
  local_50 = 0;
  local_a8 = '\x0f';
  *(undefined8 *)pwVar2 = local_40;
  if (local_c8._8_8_ == local_e0) {
    if (local_c8._8_8_ == 0) {
      bVar5 = true;
    }
    else {
      iVar1 = bcmp((void *)local_c8._0_8_,local_e8,local_c8._8_8_);
      bVar5 = iVar1 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  boost::detail::test_impl
            ("data.assume_value<variable::string_type>() == value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x13ba,"void assume_value_suite::get_string()",bVar5);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_c8.__align);
  if (local_e8 != (wchar_t *)local_d8) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_c8.__align,"alpha");
  if (local_a8 == '\x0f') {
    iVar1 = std::__cxx11::string::compare((char *)local_c8.__data);
    boost::detail::test_impl
              ("data.assume_value<variable::string_type>() == value",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
               ,0x13c0,"void assume_value_suite::get_string()",iVar1 == 0);
    trial::dynamic::detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
    ::
    call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
              ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                *)&local_c8.__align);
    local_e8 = (wchar_t *)local_d8;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_e8,L"bravo",L"");
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::wstring::_M_construct<wchar_t*>((wstring *)&local_38,local_e8,local_e8 + local_e0)
    ;
    trial::dynamic::basic_variable<std::allocator<char>>::basic_variable<std::__cxx11::wstring>
              ((basic_variable<std::allocator<char>> *)&local_c8.__align,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity * 4 + 4);
    }
    if (local_a8 == '\x10') {
      if (local_c8._8_8_ == local_e0) {
        if (local_c8._8_8_ == 0) {
          bVar5 = true;
        }
        else {
          iVar1 = wmemcmp((wchar_t *)local_c8._0_8_,local_e8,local_c8._8_8_);
          bVar5 = iVar1 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      boost::detail::test_impl
                ("data.assume_value<variable::wstring_type>() == value",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
                 ,0x13c6,"void assume_value_suite::get_string()",bVar5);
      trial::dynamic::detail::
      small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
      ::
      call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
                ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                  *)&local_c8.__align);
      if (local_e8 != (wchar_t *)local_d8) {
        operator_delete(local_e8,local_d8[0] * 4 + 4);
      }
      trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
                ((basic_variable<std::allocator<char>_> *)&local_c8.__align,L"bravo");
      if (local_a8 == '\x10') {
        iVar1 = std::__cxx11::wstring::compare((wchar_t *)local_c8.__data);
        boost::detail::test_impl
                  ("data.assume_value<variable::wstring_type>() == value",
                   "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
                   ,0x13cc,"void assume_value_suite::get_string()",iVar1 == 0);
        trial::dynamic::detail::
        small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
        ::
        call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
                  ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                    *)&local_c8.__align);
        local_e8 = (wchar_t *)local_d8;
        std::__cxx11::u16string::_M_construct<char16_t_const*>
                  ((u16string *)&local_e8,L"charlie",L"");
        local_78 = (wchar_t *)&local_68;
        std::__cxx11::u16string::_M_construct<char16_t*>
                  ((u16string *)&local_78,local_e8,(long)local_e8 + local_e0 * 2);
        local_c8._8_8_ = local_70;
        local_c8._0_8_ = local_78;
        if (local_78 == (wchar_t *)&local_68) {
          pwVar2 = (wchar_t *)(local_c8.__data + 0x18);
          local_70 = 0;
          local_68 = 0;
          local_a8 = 0x11;
          local_c8._0_8_ = local_c8.__data + 0x10;
        }
        else {
          local_60 = CONCAT62(uStack_66,local_68);
          local_78 = (wchar_t *)&local_68;
          local_70 = 0;
          local_68 = 0;
          local_a8 = 0x11;
          pwVar2 = (wchar_t *)(local_c8.__data + 0x10);
        }
        local_68 = 0;
        local_70 = 0;
        local_a8 = '\x11';
        *(undefined8 *)pwVar2 = local_60;
        uVar3 = local_c8._8_8_;
        if (local_e0 < (ulong)local_c8._8_8_) {
          uVar3 = local_e0;
        }
        if (uVar3 != 0) {
          uVar4 = 0;
          do {
            if (*(short *)((long)local_e8 + uVar4 * 2) != *(short *)(local_c8._0_8_ + uVar4 * 2)) {
              bVar5 = false;
              goto LAB_001373a0;
            }
            uVar4 = uVar4 + 1;
          } while (uVar3 != uVar4);
        }
        bVar5 = local_c8._8_8_ == local_e0;
LAB_001373a0:
        boost::detail::test_impl
                  ("data.assume_value<variable::u16string_type>() == value",
                   "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
                   ,0x13d2,"void assume_value_suite::get_string()",bVar5);
        trial::dynamic::detail::
        small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
        ::
        call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
                  ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                    *)&local_c8.__align);
        if (local_e8 != (wchar_t *)local_d8) {
          operator_delete(local_e8,local_d8[0] * 2 + 2);
        }
        trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
                  ((basic_variable<std::allocator<char>_> *)&local_c8.__align,L"charlie");
        if (local_a8 == '\x11') {
          iVar1 = std::__cxx11::
                  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
                  compare((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                           *)&local_c8.__align,L"charlie");
          boost::detail::test_impl
                    ("data.assume_value<variable::u16string_type>() == value",
                     "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
                     ,0x13d8,"void assume_value_suite::get_string()",iVar1 == 0);
          trial::dynamic::detail::
          small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
          ::
          call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
                    ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                      *)&local_c8.__align);
          local_e8 = (wchar_t *)local_d8;
          std::__cxx11::u32string::_M_construct<char32_t_const*>
                    ((u32string *)&local_e8,L"delta",L"");
          local_98 = &local_88;
          std::__cxx11::u32string::_M_construct<char32_t*>
                    ((u32string *)&local_98,local_e8,local_e8 + local_e0);
          local_c8._8_8_ = local_90;
          local_c8._0_8_ = local_98;
          if (local_98 == &local_88) {
            pwVar2 = (wchar_t *)(local_c8.__data + 0x18);
            local_90 = 0;
            local_88 = L'\0';
            local_a8 = 0x12;
            local_c8._0_8_ = local_c8.__data + 0x10;
          }
          else {
            local_80 = CONCAT44(uStack_84,local_88);
            local_98 = &local_88;
            local_90 = 0;
            local_88 = L'\0';
            local_a8 = 0x12;
            pwVar2 = (wchar_t *)(local_c8.__data + 0x10);
          }
          local_88 = L'\0';
          local_90 = 0;
          local_a8 = '\x12';
          *(undefined8 *)pwVar2 = local_80;
          uVar3 = local_c8._8_8_;
          if (local_e0 < (ulong)local_c8._8_8_) {
            uVar3 = local_e0;
          }
          if (uVar3 != 0) {
            uVar4 = 0;
            do {
              if (local_e8[uVar4] != *(wchar_t *)(local_c8._0_8_ + uVar4 * 4)) {
                bVar5 = false;
                goto LAB_0013752f;
              }
              uVar4 = uVar4 + 1;
            } while (uVar3 != uVar4);
          }
          bVar5 = local_c8._8_8_ == local_e0;
LAB_0013752f:
          boost::detail::test_impl
                    ("data.assume_value<variable::u32string_type>() == value",
                     "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
                     ,0x13de,"void assume_value_suite::get_string()",bVar5);
          trial::dynamic::detail::
          small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
          ::
          call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
                    ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                      *)&local_c8.__align);
          if (local_e8 != (wchar_t *)local_d8) {
            operator_delete(local_e8,local_d8[0] * 4 + 4);
          }
          trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
                    ((basic_variable<std::allocator<char>_> *)&local_c8.__align,L"delta");
          if (local_a8 == '\x12') {
            iVar1 = std::__cxx11::
                    basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                    compare((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                             *)&local_c8.__align,L"delta");
            boost::detail::test_impl
                      ("data.assume_value<variable::u32string_type>() == value",
                       "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
                       ,0x13e4,"void assume_value_suite::get_string()",iVar1 == 0);
            trial::dynamic::detail::
            small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
            ::
            call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
                      ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                        *)&local_c8.__align);
            return;
          }
          __function = 
          "R &trial::dynamic::basic_variable<std::allocator<char>>::assume_value() & [Allocator = std::allocator<char>, R = std::basic_string<char32_t>]"
          ;
        }
        else {
          __function = 
          "R &trial::dynamic::basic_variable<std::allocator<char>>::assume_value() & [Allocator = std::allocator<char>, R = std::basic_string<char16_t>]"
          ;
        }
        goto LAB_0013763f;
      }
    }
    __function = 
    "R &trial::dynamic::basic_variable<std::allocator<char>>::assume_value() & [Allocator = std::allocator<char>, R = std::basic_string<wchar_t>]"
    ;
  }
  else {
    __function = 
    "R &trial::dynamic::basic_variable<std::allocator<char>>::assume_value() & [Allocator = std::allocator<char>, R = std::basic_string<char>]"
    ;
  }
LAB_0013763f:
  __assert_fail("same<R>()",
                "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/cmake/../include/trial/dynamic/detail/variable.ipp"
                ,0xd31,__function);
}

Assistant:

void construct_array_from_iterator()
{
    std::vector<variable> input = { 1, 2 };
    variable data = array::make(input.begin(), input.end());
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<array>(), true);
}